

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

void __thiscall
YAML::detail::node_data::convert_sequence_to_map(node_data *this,shared_memory_holder *pMemory)

{
  ulong uVar1;
  size_type sVar2;
  node_data *pnVar3;
  node *in_RDI;
  node *key;
  stringstream stream;
  size_t i;
  string *in_stack_fffffffffffffdf8;
  node_data *in_stack_fffffffffffffe00;
  node *in_stack_fffffffffffffe28;
  node_data *in_stack_fffffffffffffe30;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  ulong local_18;
  
  reset_map(in_stack_fffffffffffffe00);
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar2 = std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::size
                      ((vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *)
                       &in_RDI[1].m_dependencies._M_t._M_impl.super__Rb_tree_header);
    if (sVar2 <= uVar1) break;
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::ostream::operator<<(local_190,local_18);
    std::__shared_ptr_access<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0xf0935c);
    pnVar3 = (node_data *)memory_holder::create_node((memory_holder *)0xf09364);
    std::__cxx11::stringstream::str();
    detail::node::set_scalar((node *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::operator[]
              ((vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *)
               &in_RDI[1].m_dependencies._M_t._M_impl.super__Rb_tree_header,local_18);
    insert_map_pair(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_RDI);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    local_18 = local_18 + 1;
    in_stack_fffffffffffffe00 = pnVar3;
  }
  reset_sequence(in_stack_fffffffffffffe00);
  *(undefined4 *)&(in_RDI->m_dependencies)._M_t._M_impl = 4;
  return;
}

Assistant:

void node_data::convert_sequence_to_map(const shared_memory_holder& pMemory) {
  assert(m_type == NodeType::Sequence);

  reset_map();
  for (std::size_t i = 0; i < m_sequence.size(); i++) {
    std::stringstream stream;
    stream << i;

    node& key = pMemory->create_node();
    key.set_scalar(stream.str());
    insert_map_pair(key, *m_sequence[i]);
  }

  reset_sequence();
  m_type = NodeType::Map;
}